

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall embree::HeightField::geometry(HeightField *this)

{
  _func_int *p_Var1;
  undefined8 uVar2;
  ulong uVar3;
  long *plVar4;
  _func_int **pp_Var5;
  reference pvVar6;
  unsigned_long *puVar7;
  Vec3fa *pVVar8;
  reference pvVar9;
  long in_RSI;
  Node *in_RDI;
  size_t tri;
  size_t p11;
  size_t p10;
  size_t p01;
  size_t p00;
  size_t x_1;
  size_t y_1;
  size_t x;
  size_t y;
  size_t height;
  size_t width;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  Ref<embree::SceneGraph::MaterialNode> mnode;
  size_t i_3;
  size_t i_2;
  Vec3fa *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  void *in_stack_fffffffffffffbe8;
  size_t in_stack_fffffffffffffbf0;
  size_t in_stack_fffffffffffffbf8;
  size_type in_stack_fffffffffffffc08;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  float Ns;
  Vec3fa *in_stack_fffffffffffffc40;
  Vec3fa *in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc50;
  float d;
  OBJMaterial *in_stack_fffffffffffffc58;
  reference pvVar10;
  size_t in_stack_fffffffffffffc78;
  HeightField *this_00;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffc80;
  TriangleMeshNode *in_stack_fffffffffffffc88;
  BBox1f in_stack_fffffffffffffc90;
  Triangle local_328;
  Triangle local_31c;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  undefined1 local_29d;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 uStack_294;
  long *local_290;
  _func_int **local_288;
  undefined1 local_27a;
  allocator local_279;
  string local_278 [32];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_238;
  undefined8 uStack_230;
  long *local_220 [3];
  undefined4 local_204;
  undefined8 *local_200;
  undefined4 local_1f4;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  Vec3fa *local_1e0;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 local_1c8;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 local_1a8;
  long *plStack_1a0;
  long **local_198;
  long **local_190;
  long **local_188;
  undefined4 *local_180;
  undefined4 *local_178;
  _func_int **local_170;
  _func_int ***local_168;
  long **local_160;
  long **local_150;
  long *local_140;
  long *local_138;
  _func_int ***local_130;
  _func_int ***local_128;
  _func_int ***local_120;
  _func_int ***local_118;
  _func_int ***local_110;
  ulong local_108;
  reference local_100;
  long local_f8;
  reference local_f0;
  _func_int ***local_e8;
  _func_int **local_d8;
  _func_int ***local_c8;
  ulong local_b8;
  ulong local_b0;
  Vec3fa *local_a8;
  ulong local_a0;
  ulong local_98;
  size_t local_90;
  ulong local_88;
  reference local_80;
  Vec3fa *local_78;
  Vec3fa *local_70;
  Vec3fa *local_68;
  Vec3fa *local_60;
  size_t local_58;
  reference local_50;
  size_t local_48;
  Vec3fa *local_40;
  reference local_38;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  reference local_10;
  size_t local_8;
  
  d = (float)((ulong)in_stack_fffffffffffffc50 >> 0x20);
  Ns = (float)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  plVar4 = (long *)SceneGraph::MaterialNode::operator_new(0x11ca64);
  local_27a = 1;
  local_200 = &local_238;
  local_204 = 0x3f800000;
  local_1a8 = 0x3f800000;
  local_1b8 = 0x3f800000;
  uStack_1b4 = 0x3f800000;
  uStack_1b0 = 0x3f800000;
  uStack_1ac = 0x3f800000;
  local_238 = 0x3f8000003f800000;
  uStack_230 = 0x3f8000003f800000;
  local_1f0 = &local_258;
  local_1f4 = 0;
  local_1c8 = 0;
  local_1d8 = 0;
  uStack_1d4 = 0;
  uStack_1d0 = 0;
  uStack_1cc = 0;
  local_258 = 0;
  uStack_250 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"",&local_279);
  OBJMaterial::OBJMaterial
            (in_stack_fffffffffffffc58,d,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,Ns,
             in_stack_fffffffffffffc30);
  local_27a = 0;
  local_198 = local_220;
  plStack_1a0 = plVar4;
  local_220[0] = plVar4;
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x10))();
  }
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  pp_Var5 = (_func_int **)::operator_new(0xd8);
  local_29d = 1;
  local_188 = &local_290;
  local_190 = local_220;
  local_290 = local_220[0];
  if (local_220[0] != (long *)0x0) {
    (**(code **)(*local_220[0] + 0x10))();
  }
  local_29c = 0x3f800000;
  local_178 = &local_298;
  local_180 = &local_29c;
  local_298 = 0x3f800000;
  uStack_294 = 0x3f800000;
  SceneGraph::TriangleMeshNode::TriangleMeshNode
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc78);
  local_29d = 0;
  local_168 = &local_288;
  local_170 = pp_Var5;
  if (pp_Var5 != (_func_int **)0x0) {
    p_Var1 = *local_288;
    local_288 = pp_Var5;
    (**(code **)(p_Var1 + 0x10))();
    pp_Var5 = local_288;
  }
  local_288 = pp_Var5;
  local_160 = &local_290;
  if (local_290 != (long *)0x0) {
    (**(code **)(*local_290 + 0x18))();
  }
  local_138 = (long *)(in_RSI + 0x10);
  local_2a8 = *(ulong *)(*local_138 + 0x10);
  local_140 = (long *)(in_RSI + 0x10);
  this_00 = (HeightField *)*local_140;
  local_2b0 = *(ulong *)&this_00->field_0x18;
  local_110 = &local_288;
  pp_Var5 = local_288;
  pvVar6 = std::
           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         *)(local_288 + 0xe),0);
  local_88 = local_2b0 * local_2a8;
  pvVar10 = pvVar6;
  local_108 = local_88;
  local_100 = pvVar6;
  local_18 = local_88;
  local_10 = pvVar6;
  if (pvVar6->size_alloced < local_88) {
    local_8 = local_88;
    if (pvVar6->size_alloced != 0) {
      local_20 = pvVar6->size_alloced;
      while (local_20 < local_18) {
        local_30[1] = 1;
        local_30[0] = local_20 << 1;
        puVar7 = std::max<unsigned_long>(local_30 + 1,local_30);
        local_20 = *puVar7;
      }
      local_8 = local_20;
    }
  }
  else {
    local_8 = pvVar6->size_alloced;
  }
  local_90 = local_8;
  uVar3 = local_88;
  if (local_88 < pvVar6->size_active) {
    while (local_98 = uVar3, local_98 < pvVar6->size_active) {
      uVar3 = local_98 + 1;
    }
    pvVar6->size_active = local_88;
  }
  local_80 = pvVar6;
  if (local_8 == pvVar6->size_alloced) {
    for (local_a0 = pvVar6->size_active; local_a0 < local_88; local_a0 = local_a0 + 1) {
      local_68 = pvVar6->items + local_a0;
    }
    pvVar6->size_active = local_88;
  }
  else {
    local_a8 = pvVar6->items;
    local_58 = local_8;
    local_50 = pvVar6;
    pVVar8 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    pvVar6->items = pVVar8;
    for (local_b0 = 0; local_b0 < pvVar6->size_active; local_b0 = local_b0 + 1) {
      local_70 = pvVar6->items + local_b0;
      local_78 = local_a8 + local_b0;
      uVar2 = *(undefined8 *)((long)&local_78->field_0 + 8);
      *(undefined8 *)&local_70->field_0 = *(undefined8 *)&local_78->field_0;
      *(undefined8 *)((long)&local_70->field_0 + 8) = uVar2;
    }
    for (local_b8 = pvVar6->size_active; local_b8 < local_88; local_b8 = local_b8 + 1) {
      local_60 = pvVar6->items + local_b8;
    }
    local_48 = pvVar6->size_alloced;
    local_40 = local_a8;
    local_38 = pvVar6;
    alignedFree(in_stack_fffffffffffffbe8);
    pvVar6->size_active = local_88;
    pvVar6->size_alloced = local_90;
  }
  for (local_2b8 = 0; local_2b8 < local_2b0; local_2b8 = local_2b8 + 1) {
    for (local_2c0 = 0; local_2c0 < local_2a8; local_2c0 = local_2c0 + 1) {
      at(this_00,(size_t)pp_Var5,(size_t)pvVar10);
      local_118 = &local_288;
      local_f0 = std::
                 vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                               *)(local_288 + 0xe),0);
      local_f8 = local_2b8 * local_2a8 + local_2c0;
      local_1e0 = local_f0->items + local_f8;
      local_1e8 = &local_2d8;
      *(undefined8 *)&local_1e0->field_0 = local_2d8;
      *(undefined8 *)((long)&local_1e0->field_0 + 8) = uStack_2d0;
    }
  }
  local_120 = &local_288;
  std::
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  ::resize(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  for (local_2e0 = 0; local_2e0 < local_2b0 - 1; local_2e0 = local_2e0 + 1) {
    for (local_2e8 = 0; local_2e8 < local_2a8 - 1; local_2e8 = local_2e8 + 1) {
      local_2f0 = local_2e0 * local_2a8 + local_2e8;
      local_2f8 = local_2e8 + 1 + local_2e0 * local_2a8;
      local_300 = (local_2e0 + 1) * local_2a8 + local_2e8;
      local_308 = local_2e8 + 1 + (local_2e0 + 1) * local_2a8;
      local_310 = local_2e0 * (local_2a8 - 1) + local_2e8;
      SceneGraph::TriangleMeshNode::Triangle::Triangle
                (&local_31c,(uint)local_2f0,(uint)local_2f8,(uint)local_300);
      local_128 = &local_288;
      pvVar9 = std::
               vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                             *)(local_288 + 0x17),local_310 * 2);
      pvVar9->v2 = local_31c.v2;
      pvVar9->v0 = local_31c.v0;
      pvVar9->v1 = local_31c.v1;
      SceneGraph::TriangleMeshNode::Triangle::Triangle
                (&local_328,(uint)local_2f8,(uint)local_308,(uint)local_300);
      local_130 = &local_288;
      pvVar9 = std::
               vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                             *)(local_288 + 0x17),local_310 * 2 + 1);
      pvVar9->v0 = local_328.v0;
      pvVar9->v1 = local_328.v1;
      pvVar9->v2 = local_328.v2;
    }
  }
  local_e8 = &local_288;
  local_d8 = local_288;
  (in_RDI->super_RefCount)._vptr_RefCount = local_288;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_c8 = &local_288;
  if (local_288 != (_func_int **)0x0) {
    (**(code **)(*local_288 + 0x18))();
  }
  local_150 = local_220;
  if (local_220[0] != (long *)0x0) {
    (**(code **)(*local_220[0] + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> geometry()
    {
      Ref<SceneGraph::MaterialNode> mnode = new OBJMaterial(1.0f,Vec3fa(1.0f),Vec3fa(0.0f),1.0f);
      Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(mnode,1);

      const size_t width = texture->width;
      const size_t height = texture->height;
      
      mesh->positions[0].resize(height*width);
      for (size_t y=0; y<height; y++) 
        for (size_t x=0; x<width; x++) 
          mesh->positions[0][y*width+x] = at(x,y);

      mesh->triangles.resize(2*(height-1)*(width-1));
      for (size_t y=0; y<height-1; y++) {
        for (size_t x=0; x<width-1; x++) {
          const size_t p00 = (y+0)*width+(x+0);
          const size_t p01 = (y+0)*width+(x+1);
          const size_t p10 = (y+1)*width+(x+0);
          const size_t p11 = (y+1)*width+(x+1);
          const size_t tri = y*(width-1)+x;
          mesh->triangles[2*tri+0] = SceneGraph::TriangleMeshNode::Triangle(unsigned(p00),unsigned(p01),unsigned(p10));
          mesh->triangles[2*tri+1] = SceneGraph::TriangleMeshNode::Triangle(unsigned(p01),unsigned(p11),unsigned(p10));
        }
      }
      return mesh.dynamicCast<SceneGraph::Node>();
    }